

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_perspective_transform
               (ALLEGRO_TRANSFORM *trans,float left,float top,float n,float right,float bottom,
               float f)

{
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM3_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM4_Db;
  ALLEGRO_TRANSFORM local_40;
  
  local_40.m[0][1] = 0.0;
  local_40.m[0][2] = 0.0;
  local_40.m[0][3] = 0.0;
  local_40.m[1][0] = 0.0;
  local_40.m[1][2] = 0.0;
  local_40.m[1][3] = 0.0;
  local_40.m[0][0] = (n + n) / (right - left);
  auVar1._0_4_ = right + left;
  auVar1._4_4_ = bottom + top;
  auVar1._8_4_ = in_XMM3_Db + in_XMM0_Db;
  auVar1._12_4_ = in_XMM4_Db + in_XMM1_Db;
  auVar2._4_4_ = top - bottom;
  auVar2._0_4_ = right - left;
  auVar2._8_4_ = in_XMM3_Db - in_XMM0_Db;
  auVar2._12_4_ = in_XMM1_Db - in_XMM4_Db;
  auVar2 = divps(auVar1,auVar2);
  local_40.m[1][1] = (n + n) / (top - bottom);
  local_40.m[2]._0_8_ = auVar2._0_8_;
  local_40.m[2][2] = -(n + f) / (f - n);
  local_40.m[2][3] = -1.0;
  local_40.m[3][0] = 0.0;
  local_40.m[3]._4_8_ = (ulong)(uint)((f * -2.0 * n) / (f - n)) << 0x20;
  local_40.m[3][3] = 0.0;
  al_compose_transform(trans,&local_40);
  return;
}

Assistant:

void al_perspective_transform(ALLEGRO_TRANSFORM *trans,
   float left, float top, float n,
   float right, float bottom, float f)
{
   float delta_x = right - left;
   float delta_y = top - bottom;
   float delta_z = f - n;
   ALLEGRO_TRANSFORM tmp;

   al_identity_transform(&tmp);

   tmp.m[0][0] = 2.0f * n / delta_x;
   tmp.m[1][1] = 2.0f * n / delta_y;
   tmp.m[2][0] = (right + left) / delta_x;
   tmp.m[2][1] = (top + bottom) / delta_y;
   tmp.m[2][2] = -(f + n) / delta_z;
   tmp.m[2][3] = -1.0f;
   tmp.m[3][2] = -2.0f * f * n / delta_z;
   tmp.m[3][3] = 0;

   al_compose_transform(trans, &tmp);
}